

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cfg.cpp
# Opt level: O0

MPP_RET check_cfg_info(MppCfgInfo *node,char *name,CfgType type,char *func)

{
  int iVar1;
  MPP_RET local_3c;
  MPP_RET ret;
  RK_S32 cfg_size;
  CfgType cfg_type;
  char *func_local;
  CfgType type_local;
  char *name_local;
  MppCfgInfo *node_local;
  
  if (node == (MppCfgInfo *)0x0) {
    _mpp_log_l(2,"mpp_cfg","%s: cfg %s is invalid\n",(char *)0x0,func,name);
    node_local._4_4_ = MPP_NOK;
  }
  else {
    iVar1 = node->data_size;
    local_3c = MPP_OK;
    switch(type) {
    case CFG_FUNC_TYPE_S32:
    case CFG_FUNC_TYPE_U32:
      if (iVar1 != 4) {
        show_cfg_info_err(node,type,func,name);
        local_3c = MPP_NOK;
      }
      break;
    case CFG_FUNC_TYPE_S64:
    case CFG_FUNC_TYPE_U64:
      if (iVar1 != 8) {
        show_cfg_info_err(node,type,func,name);
        local_3c = MPP_NOK;
      }
      break;
    case CFG_FUNC_TYPE_St:
      if (node->data_type != type) {
        show_cfg_info_err(node,type,func,name);
        local_3c = MPP_NOK;
      }
      if (iVar1 < 1) {
        _mpp_log_l(2,"mpp_cfg","%s: cfg %s found invalid size %d\n",(char *)0x0,func,name,iVar1);
        local_3c = MPP_NOK;
      }
      break;
    case CFG_FUNC_TYPE_Ptr:
      if (node->data_type != type) {
        show_cfg_info_err(node,type,func,name);
        local_3c = MPP_NOK;
      }
      break;
    default:
      _mpp_log_l(2,"mpp_cfg","%s: cfg %s found invalid cfg type %d\n",(char *)0x0,func,name,type);
      local_3c = MPP_NOK;
    }
    node_local._4_4_ = local_3c;
  }
  return node_local._4_4_;
}

Assistant:

MPP_RET check_cfg_info(MppCfgInfo *node, const char *name, CfgType type,
                       const char *func)
{
    if (NULL == node) {
        mpp_err("%s: cfg %s is invalid\n", func, name);
        return MPP_NOK;
    }

    CfgType cfg_type = (CfgType)node->data_type;
    RK_S32 cfg_size = node->data_size;
    MPP_RET ret = MPP_OK;

    switch (type) {
    case CFG_FUNC_TYPE_St : {
        if (cfg_type != type) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
        if (cfg_size <= 0) {
            mpp_err("%s: cfg %s found invalid size %d\n", func, name, cfg_size);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_Ptr : {
        if (cfg_type != type) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_S32 :
    case CFG_FUNC_TYPE_U32 : {
        if (cfg_size != sizeof(RK_S32)) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_S64 :
    case CFG_FUNC_TYPE_U64 : {
        if (cfg_size != sizeof(RK_S64)) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    default : {
        mpp_err("%s: cfg %s found invalid cfg type %d\n", func, name, type);
        ret = MPP_NOK;
    } break;
    }

    return ret;
}